

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeSets.cpp
# Opt level: O1

string * Lodtalk::getSistaBytecodeName_abi_cxx11_(int bytecode)

{
  char *pcVar1;
  long lVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  char buffer [64];
  char local_98 [72];
  value_type local_50;
  
  if (sistaByteCodeNames_abi_cxx11_ == DAT_001673b0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unssuported","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sistaByteCodeNames_abi_cxx11_,0x100,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    lVar2 = 0;
    uVar3 = 0;
    do {
      sprintf(local_98,"PushReceiverVariableShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x10);
    lVar2 = 0x200;
    uVar3 = 0;
    do {
      sprintf(local_98,"PushLiteralVariableShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x10);
    lVar2 = 0x400;
    uVar3 = 0;
    do {
      sprintf(local_98,"PushLiteralShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x20);
    lVar2 = 0x800;
    uVar3 = 0;
    do {
      sprintf(local_98,"PushTempShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0xc);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x980,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x988),0x150314);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x9a0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x9a8),0x150321);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x9c0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x9c8),0x15032a);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x9e0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x9e8),0x150334);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xa00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xa08),0x15033c);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xa20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xa28),0x150345);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xa40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xa48),0x15034d);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xa60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xa68),0x15035d);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xb00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xb08),0x15036f);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xb20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xb28),0x15037e);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xb40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xb48),0x150389);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xb60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xb68),0x15039a);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xb80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xb88),0x1503a9);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xba0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xba8),0x150395);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xbc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xbc8),0x1503a4);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xbe0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xbe8),0x1503b3);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xc00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xc08),0x1503b7);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xc20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xc28),0x1503c9);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xc40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xc48),0x1503dd);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xc60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xc68),0x1503f4);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xc80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xc88),0x15040e);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xca0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xca8),0x150426);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xcc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xcc8),0x150441);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xce0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xce8),0x150455);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xd00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xd08),0x15046c);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xd20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xd28),0x150483);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xd40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xd48),0x150498);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xd60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xd68),0x1504b0);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xd80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xd88),0x1504c8);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xda0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xda8),0x1504df);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xdc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xdc8),0x1504fd);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xde0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xde8),0x150512);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xe00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xe08),0x150526);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xe20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xe28),0x150537);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xe40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xe48),0x15054b);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xe60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xe68),0x15055e);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xe80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xe88),0x150571);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xea0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xea8),0x150587);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xec0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xec8),0x15059b);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xee0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xee8),0x1505b7);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xf20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xf28),0x1505cb);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xf40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xf48),0x1505df);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xf60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xf68),0x1505f6);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xf80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xf88),0x150607);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 4000,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xfa8),0x150619);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xfc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xfc8),0x150630);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0xfe0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0xfe8),0x150640);
    lVar2 = 0x1000;
    uVar3 = 0;
    do {
      sprintf(local_98,"SendShortArgs0: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x10);
    lVar2 = 0x1200;
    uVar3 = 0;
    do {
      sprintf(local_98,"SendShortArgs1: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x10);
    lVar2 = 0x1400;
    uVar3 = 0;
    do {
      sprintf(local_98,"SendShortArgs2: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 0x10);
    lVar2 = 0x1600;
    uVar3 = 0;
    do {
      sprintf(local_98,"JumpShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 8);
    lVar2 = 0x1700;
    uVar3 = 0;
    do {
      sprintf(local_98,"JumpOnTrueShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 8);
    lVar2 = 0x1800;
    uVar3 = 0;
    do {
      sprintf(local_98,"JumpOnFalseShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 8);
    lVar2 = 0x1900;
    uVar3 = 0;
    do {
      sprintf(local_98,"PopStoreReceiverVariableShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 8);
    lVar2 = 0x1a00;
    uVar3 = 0;
    do {
      sprintf(local_98,"PopStoreTemporalVariableShort: %d",uVar3 & 0xffffffff);
      pcVar1 = *(char **)(sistaByteCodeNames_abi_cxx11_ + 8 + lVar2);
      uVar4 = sistaByteCodeNames_abi_cxx11_ + lVar2;
      strlen(local_98);
      std::__cxx11::string::_M_replace(uVar4,0,pcVar1,(ulong)local_98);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 != 8);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1b00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1b08),0x150704);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1c00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1c08),0x150710);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1c20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1c28),0x150718);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1c40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1c48),0x150720);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1c60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1c68),0x150735);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1c80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1c88),0x150749);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1ca0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1ca8),0x150755);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1cc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1cc8),0x150763);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1ce0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1ce8),0x15076e);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1d00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1d08),0x15077a);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1d20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1d28),0x150788);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1d40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1d48),0x1507a3);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1d60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1d68),0x15079e);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1d80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1d88),0x1507a8);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1da0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1da8),0x1507b7);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1dc0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1dc8),0x1507bc);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1de0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1de8),0x1507c7);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1e00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1e08),0x1507d3);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1e20,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1e28),0x1507ec);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1e40,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1e48),0x150804);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1e60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1e68),0x1507d6);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1e80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1e88),0x1507ef);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1ea0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1ea8),0x150807);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1f00,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1f08),0x15081d);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 8000,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1f48),0x15082b);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1f60,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1f68),0x150837);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1f80,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1f88),0x150850);
    std::__cxx11::string::_M_replace
              (sistaByteCodeNames_abi_cxx11_ + 0x1fa0,0,
               *(char **)(sistaByteCodeNames_abi_cxx11_ + 0x1fa8),0x15084d);
  }
  return (string *)((long)bytecode * 0x20 + sistaByteCodeNames_abi_cxx11_);
}

Assistant:

const std::string &getSistaBytecodeName(int bytecode)
{
    if(sistaByteCodeNames.empty())
    {
        char buffer[64];
        sistaByteCodeNames.resize(256, "unssuported");

        #define SISTAV1_INSTRUCTION_RANGE(name, range_first, range_end) \
        for(int i = range_first; i <= range_end; ++i) {\
            sprintf(buffer, #name ": %d", i - range_first); \
            sistaByteCodeNames[i] = buffer; \
        }
        #define SISTAV1_INSTRUCTION(name, opcode) \
            sistaByteCodeNames[opcode] = #name;

        #include "SistaV1BytecodeSet.inc"

        #undef SISTAV1_INSTRUCTION_RANGE
        #undef SISTAV1_INSTRUCTION

    }

    return sistaByteCodeNames[bytecode];
}